

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

LONG PAL_atol(char *szNumber)

{
  long lVar1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  lVar1 = atol(szNumber);
  return (LONG)lVar1;
}

Assistant:

LONG
__cdecl
PAL_atol(const char *szNumber)
{
    long lResult;

    PERF_ENTRY(atol);
    ENTRY("atol (szNumber=%p (%s))\n",
        szNumber?szNumber:"NULL"
        );

    lResult = atol(szNumber);

    LOGEXIT("atol returning long %ld\n", (LONG)lResult);
    PERF_EXIT(atol);
    /* This explicit cast to LONG is used to silence any potential warnings
        due to implicitly casting the native long lResult to LONG when returning. */
    return (LONG)lResult;

}